

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notifier.hpp
# Opt level: O3

void __thiscall tf::Notifier::notify_n(Notifier *this,size_t n)

{
  ulong uVar1;
  
  uVar1 = ((long)(this->_waiters).
                 super__Vector_base<tf::Notifier::Waiter,_std::allocator<tf::Notifier::Waiter>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_waiters).
                 super__Vector_base<tf::Notifier::Waiter,_std::allocator<tf::Notifier::Waiter>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
  if (n <= uVar1 && uVar1 - n != 0) {
    if (n != 0) {
      do {
        notify(this,false);
        n = n - 1;
      } while (n != 0);
    }
    return;
  }
  notify(this,true);
  return;
}

Assistant:

void notify_n(size_t n) {
    if(n >= _waiters.size()) {
      notify(true);
    }
    else {
      for(size_t k=0; k<n; ++k) {
        notify(false);
      }
    }
  }